

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O2

void P_ActivateInStasisCeiling(int tag)

{
  DCeiling *this;
  TThinkerIterator<DCeiling> iterator;
  FThinkerIterator FStack_28;
  
  TThinkerIterator<DCeiling>::TThinkerIterator((TThinkerIterator<DCeiling> *)&FStack_28,0x80);
  while( true ) {
    this = (DCeiling *)FThinkerIterator::Next(&FStack_28);
    if (this == (DCeiling *)0x0) break;
    if ((this->m_Tag == tag) && (this->m_Direction == 0)) {
      this->m_Direction = this->m_OldDirection;
      DCeiling::PlayCeilingSound(this);
    }
  }
  return;
}

Assistant:

void P_ActivateInStasisCeiling (int tag)
{
	DCeiling *scan;
	TThinkerIterator<DCeiling> iterator;

	while ( (scan = iterator.Next ()) )
	{
		if (scan->m_Tag == tag && scan->m_Direction == 0)
		{
			scan->m_Direction = scan->m_OldDirection;
			scan->PlayCeilingSound ();
		}
	}
}